

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O2

void mpifftnd_dif(int *dim,int *pdim,int ndim,int *pidx,int inv,int size_in,int *inembed,int *oembed
                 ,cpx_t *work,cpx_t *scratch,plan_t *plans_short,plan_t *plans_long,int **rho_L,
                 int **rho_pk0,int **rho_Lk0,int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,
                 int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  plan_t *ppVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  plan_t plan_short;
  plan_t plan_long;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  cpx_t *pcVar19;
  ulong uVar20;
  ulong uVar21;
  int *in_stack_ffffffffffffff28;
  
  uVar15 = 0;
  if (0 < ndim) {
    uVar15 = (ulong)(uint)ndim;
  }
  for (uVar18 = 0; uVar18 != uVar15; uVar18 = uVar18 + 1) {
    uVar2 = plans_short[uVar18].odist;
    uVar4 = plans_short[uVar18].howmany;
    plan_short.howmany = uVar4;
    plan_short.odist = uVar2;
    ppVar1 = plans_short + uVar18;
    uVar6 = ppVar1->n;
    uVar7 = ppVar1->istride;
    uVar8 = ppVar1->ostride;
    uVar9 = ppVar1->idist;
    plan_short.idist = uVar9;
    plan_short.ostride = uVar8;
    plan_short.istride = uVar7;
    plan_short.n = uVar6;
    uVar3 = plans_long[uVar18].odist;
    uVar5 = plans_long[uVar18].howmany;
    plan_long.howmany = uVar5;
    plan_long.odist = uVar3;
    ppVar1 = plans_long + uVar18;
    uVar10 = ppVar1->n;
    uVar11 = ppVar1->istride;
    uVar12 = ppVar1->ostride;
    uVar13 = ppVar1->idist;
    plan_long.idist = uVar13;
    plan_long.ostride = uVar12;
    plan_long.istride = uVar11;
    plan_long.n = uVar10;
    mpifft1d_dif(dim,pdim,ndim,(int)uVar18,pidx,inv,size_in,inembed,work,scratch,plan_short,
                 plan_long,rho_L[uVar18],rho_pk0[uVar18],in_stack_ffffffffffffff28,dfft_nsend,
                 dfft_nrecv,dfft_offset_send,dfft_offset_recv,comm,proc_map,row_m);
    uVar16 = (long)dim[uVar18] / (long)pdim[uVar18] & 0xffffffff;
    uVar14 = size_in / inembed[uVar18];
    uVar17 = 0;
    if (0 < (int)uVar14) {
      uVar17 = (ulong)uVar14;
    }
    if ((int)((long)dim[uVar18] / (long)pdim[uVar18]) < 1) {
      uVar16 = 0;
    }
    pcVar19 = scratch;
    for (uVar20 = 0; uVar20 != uVar16; uVar20 = uVar20 + 1) {
      for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
        work[uVar20 + (long)(int)uVar21 * (long)oembed[uVar18]] = pcVar19[uVar21];
      }
      pcVar19 = pcVar19 + (int)uVar14;
    }
    size_in = (size_in * oembed[uVar18]) / inembed[uVar18];
  }
  return;
}

Assistant:

void mpifftnd_dif(int *dim,
            int *pdim,
            int ndim,
            int* pidx,
            int inv,
            int size_in,
            int *inembed,
            int *oembed,
            cpx_t *work,
            cpx_t *scratch,
            plan_t *plans_short,
            plan_t *plans_long,
            int **rho_L,
            int **rho_pk0,
            int **rho_Lk0,
            int *dfft_nsend,
            int *dfft_nrecv,
            int *dfft_offset_send,
            int *dfft_offset_recv,
            MPI_Comm comm,
            int *proc_map,
            int row_m)
    {
    int size = size_in;
    int current_dim;
    for (current_dim = 0; current_dim < ndim; ++current_dim)
        {
        /* assume input in local column major */
        mpifft1d_dif(dim, pdim,ndim,current_dim,pidx, inv,
            size, inembed, work, scratch, plans_short[current_dim],
            plans_long[current_dim], rho_L[current_dim],
            rho_pk0[current_dim],rho_Lk0[current_dim],
            dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,
            comm,proc_map, row_m);

        int l = dim[current_dim]/pdim[current_dim];
        int stride = size/inembed[current_dim];

        /* transpose local matrix */
        int i;
        #pragma omp parallel for private(i)
        for (i = 0; i < l; ++i)
            {
            int j;
            for (j = 0; j < stride; ++j)
                {
                int gidx = j+i*stride;
                int new_idx = j*oembed[current_dim]+i;
                work[new_idx] = scratch[gidx];
                }
            }

        /* update size */
        size *= oembed[current_dim];
        size /= inembed[current_dim];
        }
    }